

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O2

void __thiscall SqlGenerator::generateLmfaoQuery(SqlGenerator *this)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  pointer ppAVar4;
  Aggregate *pAVar5;
  long lVar6;
  unsigned_long __val;
  unsigned_long __val_00;
  bool bVar7;
  size_t sVar8;
  View *pVVar9;
  TDNode *pTVar10;
  size_t __n;
  Attribute *pAVar11;
  ulong uVar12;
  size_t i;
  long lVar13;
  long lVar14;
  reference rVar15;
  ulong local_3f8;
  string viewAgg;
  long local_3c0;
  string agg;
  string localAgg;
  string local_370;
  ulong local_350;
  ulong local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string aggregateString;
  string fvars;
  string returnString;
  string local_250;
  ofstream ofs;
  
  std::__cxx11::string::string((string *)&returnString,"",(allocator *)&ofs);
  local_3f8 = 0;
  while( true ) {
    sVar8 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar8 <= local_3f8) break;
    pVVar9 = QueryCompiler::getView
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_3f8);
    pTVar10 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar9->_origin);
    uVar3 = pVVar9->_origin;
    uVar1 = pVVar9->_destination;
    sVar8 = pTVar10->_numOfNeighbors;
    __n = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&ofs,__n,(allocator_type *)&fvars);
    std::__cxx11::string::string((string *)&fvars,"",(allocator *)&aggregateString);
    lVar2 = sVar8 - (uVar3 != uVar1);
    for (sVar8 = 0; sVar8 != 100; sVar8 = sVar8 + 1) {
      bVar7 = std::bitset<100UL>::test(&pVVar9->_fVars,sVar8);
      if (bVar7) {
        pAVar11 = TreeDecomposition::getAttribute
                            ((this->_td).
                             super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,sVar8);
        std::operator+(&aggregateString,&pAVar11->_name,",");
        std::__cxx11::string::append((string *)&fvars);
        std::__cxx11::string::~string((string *)&aggregateString);
      }
    }
    std::__cxx11::string::string((string *)&aggregateString,"",(allocator *)&agg);
    uVar12 = 0;
    while (ppAVar4 = (pVVar9->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(pVVar9->_aggregates).
                                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar4 >> 3)) {
      pAVar5 = ppAVar4[uVar12];
      local_350 = uVar12;
      std::__cxx11::string::string((string *)&agg,"",(allocator *)&localAgg);
      local_3c0 = 8;
      for (local_348 = 0;
          local_348 <
          (ulong)(((long)*(pointer *)
                          ((long)&(pAVar5->_agg).
                                  super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                  ._M_impl + 8) -
                  *(long *)&(pAVar5->_agg).
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl) / 0xc0); local_348 = local_348 + 1) {
        std::__cxx11::string::string((string *)&localAgg,"",(allocator *)&viewAgg);
        lVar13 = local_348 * 0xc0;
        lVar14 = *(long *)&(pAVar5->_agg).
                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                           ._M_impl;
        for (sVar8 = 0; sVar8 != 0x5dc; sVar8 = sVar8 + 1) {
          bVar7 = std::bitset<1500UL>::test((bitset<1500UL> *)(lVar13 + lVar14),sVar8);
          if (bVar7) {
            getFunctionString_abi_cxx11_(&local_370,this,sVar8);
            std::operator+(&viewAgg,&local_370,"*");
            std::__cxx11::string::append((string *)&localAgg);
            std::__cxx11::string::~string((string *)&viewAgg);
            std::__cxx11::string::~string((string *)&local_370);
          }
        }
        std::__cxx11::string::append((string *)&agg);
        std::__cxx11::string::string((string *)&viewAgg,"",(allocator *)&local_370);
        lVar14 = local_3c0;
        lVar13 = lVar2;
        while (bVar7 = lVar13 != 0, lVar13 = lVar13 + -1, bVar7) {
          lVar6 = *(long *)&(pAVar5->_incoming).
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data;
          __val = *(unsigned_long *)(lVar6 + -8 + lVar14);
          __val_00 = *(unsigned_long *)(lVar6 + lVar14);
          std::__cxx11::to_string(&local_320,__val);
          std::operator+(&local_300,"agg_",&local_320);
          std::operator+(&local_340,&local_300,"_");
          std::__cxx11::to_string(&local_250,__val_00);
          std::operator+(&local_2e0,&local_340,&local_250);
          std::operator+(&local_370,&local_2e0,"*");
          std::__cxx11::string::append((string *)&viewAgg);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&ofs,__val);
          *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
          lVar14 = lVar14 + 0x10;
        }
        std::__cxx11::string::append((string *)&agg);
        if (agg._M_string_length != 0) {
          std::__cxx11::string::pop_back();
          std::__cxx11::string::append((char *)&agg);
        }
        std::__cxx11::string::~string((string *)&viewAgg);
        std::__cxx11::string::~string((string *)&localAgg);
        local_3c0 = local_3c0 + lVar2 * 0x10;
      }
      if (agg._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&agg);
      }
      else {
        std::__cxx11::string::pop_back();
      }
      std::operator+(&local_300,"\nSUM(",&agg);
      std::operator+(&local_340,&local_300,") AS agg_");
      std::__cxx11::to_string(&local_320,local_3f8);
      std::operator+(&local_2e0,&local_340,&local_320);
      std::operator+(&local_370,&local_2e0,"_");
      std::__cxx11::to_string(&local_250,local_350);
      std::operator+(&viewAgg,&local_370,&local_250);
      std::operator+(&localAgg,&viewAgg,",");
      std::__cxx11::string::append((string *)&aggregateString);
      std::__cxx11::string::~string((string *)&localAgg);
      std::__cxx11::string::~string((string *)&viewAgg);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&agg);
      uVar12 = local_350 + 1;
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::to_string(&local_320,local_3f8);
    std::operator+(&local_300,"CREATE TABLE view_",&local_320);
    std::operator+(&local_340,&local_300," AS\nSELECT ");
    std::operator+(&local_2e0,&local_340,&fvars);
    std::operator+(&local_370,&local_2e0,&aggregateString);
    std::operator+(&viewAgg,&local_370,"\nFROM ");
    pTVar10 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar9->_origin);
    std::operator+(&localAgg,&viewAgg,&pTVar10->_name);
    std::operator+(&agg,&localAgg," ");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&agg);
    std::__cxx11::string::~string((string *)&localAgg);
    std::__cxx11::string::~string((string *)&viewAgg);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    uVar12 = 0;
    while( true ) {
      sVar8 = QueryCompiler::numberOfViews
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (sVar8 <= uVar12) break;
      rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&ofs,uVar12);
      if ((*rVar15._M_p & rVar15._M_mask) != 0) {
        std::__cxx11::to_string(&viewAgg,uVar12);
        std::operator+(&localAgg,"NATURAL JOIN view_",&viewAgg);
        std::operator+(&agg,&localAgg," ");
        std::__cxx11::string::append((string *)&returnString);
        std::__cxx11::string::~string((string *)&agg);
        std::__cxx11::string::~string((string *)&localAgg);
        std::__cxx11::string::~string((string *)&viewAgg);
      }
      uVar12 = uVar12 + 1;
    }
    if (fvars._M_string_length != 0) {
      std::__cxx11::string::pop_back();
      std::operator+(&agg,"\nGROUP BY ",&fvars);
      std::__cxx11::string::append((string *)&returnString);
      std::__cxx11::string::~string((string *)&agg);
    }
    std::__cxx11::string::append((char *)&returnString);
    std::__cxx11::string::~string((string *)&aggregateString);
    std::__cxx11::string::~string((string *)&fvars);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&ofs);
    local_3f8 = local_3f8 + 1;
  }
  std::operator+(&fvars,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/lmfao.sql");
  std::ofstream::ofstream(&ofs,(string *)&fvars,_S_out);
  std::__cxx11::string::~string((string *)&fvars);
  std::operator<<((ostream *)&ofs,(string *)&returnString);
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&returnString);
  return;
}

Assistant:

void SqlGenerator::generateLmfaoQuery()
{
    string returnString = "";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* v = _qc->getView(viewID);
        TDNode* node = _td->getRelation(v->_origin);

        size_t numberIncomingViews =
            (v->_origin == v->_destination ? node->_numOfNeighbors :
             node->_numOfNeighbors - 1);
        
        vector<bool> viewBitset(_qc->numberOfViews());

        string fvars = ""; 
        for (size_t i = 0; i < NUM_OF_VARIABLES; ++i)
            if (v->_fVars.test(i))
                fvars +=  _td->getAttribute(i)->_name + ",";
       
        string aggregateString = "";
        for (size_t aggNo = 0; aggNo < v->_aggregates.size(); ++aggNo)
        {
            Aggregate* aggregate = v->_aggregates[aggNo];

            string agg = "";
            size_t incomingCounter = 0;
            for (size_t i = 0; i < aggregate->_agg.size(); ++i)
            {
                string localAgg = "";
                const prod_bitset& product = aggregate->_agg[i];
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                {  
                    if (product.test(f))
                        localAgg += getFunctionString(f)+"*";
                }

                agg += localAgg;
                
                string viewAgg = "";
                for (size_t n = 0; n < numberIncomingViews; ++n)
                {
                    std::pair<size_t,size_t> viewAggID =
                        aggregate->_incoming[incomingCounter];
                    
                    viewAgg += "agg_"+to_string(viewAggID.first)+"_"+
                        to_string(viewAggID.second)+"*";
                    viewBitset[viewAggID.first] = 1;
                    ++incomingCounter;
                }

                agg += viewAgg;

                if (!agg.empty())
                {
                    agg.pop_back();
                    agg += "+";
                }              
            }

            if (agg.empty())
                agg = "1";
            else
                agg.pop_back();

            aggregateString += "\nSUM("+agg+") AS agg_"+to_string(viewID)+
                "_"+to_string(aggNo)+",";
        }

        aggregateString.pop_back();

        
        returnString += "CREATE TABLE view_"+to_string(viewID)+" AS\nSELECT "+fvars+
            aggregateString+"\nFROM "+_td->getRelation(v->_origin)->_name+" ";
        for (size_t id = 0; id < _qc->numberOfViews(); ++id)
            if (viewBitset[id])
                returnString += "NATURAL JOIN view_"+to_string(id)+" ";

        if (!fvars.empty())
        {
            fvars.pop_back();
            returnString += "\nGROUP BY "+fvars;
        }
        
        returnString += ";\n\n";
    }

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/lmfao.sql", std::ofstream::out);
    ofs << returnString;
    ofs.close();
    // DINFO(returnString);   
}